

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::ErrnoLogMessage::~ErrnoLogMessage(ErrnoLogMessage *this)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int err;
  string local_30;
  ErrnoLogMessage *local_10;
  ErrnoLogMessage *this_local;
  
  local_10 = this;
  poVar3 = LogMessage::stream(&this->super_LogMessage);
  poVar3 = std::operator<<(poVar3,": ");
  uVar1 = LogMessage::preserved_errno(&this->super_LogMessage);
  StrError_abi_cxx11_(&local_30,(google *)(ulong)uVar1,err);
  poVar3 = std::operator<<(poVar3,(string *)&local_30);
  poVar3 = std::operator<<(poVar3," [");
  iVar2 = LogMessage::preserved_errno(&this->super_LogMessage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"]");
  std::__cxx11::string::~string((string *)&local_30);
  LogMessage::~LogMessage(&this->super_LogMessage);
  return;
}

Assistant:

ErrnoLogMessage::~ErrnoLogMessage() {
  // Don't access errno directly because it may have been altered
  // while streaming the message.
  stream() << ": " << StrError(preserved_errno()) << " ["
           << preserved_errno() << "]";
}